

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O2

void DispGyroData(void)

{
  puts("Gyro Data:");
  printf("Pitch:%f\t",(double)GyroData.Pitch);
  printf("Roll:%f\t",(double)GyroData.Roll);
  printf("Yaw:%f\t",(double)GyroData.Yaw);
  putchar(10);
  printf("Gyro_X:%f\t",(double)GyroData.Gyro_X);
  printf("Gyro_Y:%f\t",(double)GyroData.Gyro_Y);
  printf("Gyro_Z:%f\t",(double)GyroData.Gyro_Z);
  putchar(10);
  return;
}

Assistant:

void DispGyroData(void)
{
	printf("Gyro Data:\n");
	printf("Pitch:%f\t", GyroData.Pitch);
	printf("Roll:%f\t", GyroData.Roll);
	printf("Yaw:%f\t", GyroData.Yaw);
	printf("\n");
	printf("Gyro_X:%f\t", GyroData.Gyro_X);
	printf("Gyro_Y:%f\t", GyroData.Gyro_Y);
	printf("Gyro_Z:%f\t", GyroData.Gyro_Z);
	printf("\n");
}